

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qelfparser_p.cpp
# Opt level: O0

QLibraryScanResult QElfParser::parse(QByteArrayView data,QString *errMsg)

{
  QByteArrayView data_00;
  QByteArrayView data_01;
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  QNoDebug *pQVar4;
  const_pointer pvVar5;
  QString *in_RDX;
  storage_type *in_RSI;
  ErrorMaker *in_RDI;
  long in_FS_OFFSET;
  QByteArrayView in_stack_000000a0;
  Ehdr *header;
  ErrorMaker error;
  QLibraryScanResult r;
  undefined4 in_stack_fffffffffffffda8;
  int in_stack_fffffffffffffdac;
  int in_stack_fffffffffffffdb0;
  undefined2 in_stack_fffffffffffffdb4;
  unsigned_short in_stack_fffffffffffffdb6;
  Ehdr *in_stack_fffffffffffffdb8;
  undefined8 in_stack_fffffffffffffdc8;
  QChar fillChar;
  QString *in_stack_fffffffffffffde0;
  QString *text;
  undefined4 in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdec;
  undefined4 uVar6;
  ErrorMaker *in_stack_fffffffffffffdf0;
  undefined8 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe28;
  undefined4 in_stack_fffffffffffffe2c;
  ErrorMaker *in_stack_fffffffffffffe88;
  QChar local_164;
  QChar local_162;
  QString local_160 [3];
  QNoDebug local_113;
  QChar local_112 [25];
  ErrorMaker *local_e0;
  storage_type *local_d8;
  ErrorMaker *error_00;
  QChar local_ba [28];
  QNoDebug local_82;
  QNoDebug local_81 [25];
  ElfHeaderDebug local_68;
  QNoDebug local_59 [25];
  unsigned_long local_40;
  QNoDebug local_31;
  ErrorMaker local_30;
  QByteArrayView local_28;
  QLibraryScanResult local_18;
  long local_8;
  
  fillChar.ucs = (char16_t)((ulong)in_stack_fffffffffffffdc8 >> 0x30);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_30.errMsg = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  local_28.m_size = (qsizetype)in_RDI;
  local_28.m_data = in_RSI;
  anon_unknown.dwarf_1486d0f::ErrorMaker::ErrorMaker(&local_30,in_RDX);
  uVar3 = QByteArrayView::size(&local_28);
  if (uVar3 < 0x40) {
    pQVar4 = QNoDebug::operator<<(&local_31,(char (*) [16])"file too small:");
    local_40 = QByteArrayView::size(&local_28);
    QNoDebug::operator<<(pQVar4,&local_40);
    QLibrary::tr((char *)in_stack_fffffffffffffdb8,
                 (char *)CONCAT26(in_stack_fffffffffffffdb6,
                                  CONCAT24(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0)),
                 in_stack_fffffffffffffdac);
    local_18 = anon_unknown.dwarf_1486d0f::ErrorMaker::operator()
                         ((ErrorMaker *)
                          CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                          in_stack_fffffffffffffde0);
    QString::~QString((QString *)0x8c9c0e);
  }
  else {
    local_68.e_ident = (uchar *)QByteArrayView::data(&local_28);
    QNoDebug::operator<<(local_59,&local_68);
    pvVar5 = QByteArrayView::data(&local_28);
    bVar1 = anon_unknown.dwarf_1486d0f::ElfHeaderCheck<unsigned_long_long,_(QSysInfo::Endian)1>::
            checkHeader((Ehdr *)CONCAT44(in_stack_fffffffffffffdac,in_stack_fffffffffffffda8));
    if (bVar1) {
      pQVar4 = QNoDebug::operator<<(local_81,(char (*) [9])0x9c52a6);
      pQVar4 = QNoDebug::operator<<(pQVar4,(unsigned_short *)(pvVar5 + 0x38));
      pQVar4 = QNoDebug::operator<<(pQVar4,(char (*) [19])"program headers of");
      pQVar4 = QNoDebug::operator<<(pQVar4,(unsigned_short *)(pvVar5 + 0x36));
      pQVar4 = QNoDebug::operator<<(pQVar4,(char (*) [16])"bytes at offset");
      QNoDebug::operator<<(pQVar4,(unsigned_long *)(pvVar5 + 0x20));
      pQVar4 = QNoDebug::operator<<(&local_82,(char (*) [9])0x9c52a6);
      pQVar4 = QNoDebug::operator<<(pQVar4,(unsigned_short *)(pvVar5 + 0x3c));
      pQVar4 = QNoDebug::operator<<(pQVar4,(char (*) [12])"sections of");
      pQVar4 = QNoDebug::operator<<(pQVar4,(unsigned_short *)(pvVar5 + 0x3a));
      pQVar4 = QNoDebug::operator<<(pQVar4,(char (*) [16])"bytes at offset");
      pQVar4 = QNoDebug::operator<<(pQVar4,(unsigned_long *)(pvVar5 + 0x28));
      pQVar4 = QNoDebug::operator<<
                         (pQVar4,(char (*) [50])"; section header string table (shstrtab) is entry")
      ;
      QNoDebug::operator<<(pQVar4,(unsigned_short *)(pvVar5 + 0x3e));
      if (*(short *)(pvVar5 + 0x36) == 0x38) {
        data_01.m_data = local_28.m_data;
        data_01.m_size = local_28.m_size;
        error_00 = (ErrorMaker *)local_28.m_size;
        bVar1 = preScanProgramHeaders(data_01,in_stack_fffffffffffffe88);
        if (bVar1) {
          local_18.length = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_18.pos = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_e0 = (ErrorMaker *)local_28.m_size;
          local_d8 = local_28.m_data;
          data_00.m_data._0_4_ = in_stack_fffffffffffffe28;
          data_00.m_size = in_stack_fffffffffffffe20;
          data_00.m_data._4_4_ = in_stack_fffffffffffffe2c;
          local_18 = scanProgramHeadersForNotes(data_00,(ErrorMaker *)in_stack_fffffffffffffde0);
          if (local_18.length == 0) {
            if (*(short *)(pvVar5 + 0x3a) == 0x40) {
              if ((*(long *)(pvVar5 + 0x28) == 0) || (*(short *)(pvVar5 + 0x3c) == 0)) {
                QNoDebug::operator<<
                          (&local_113,
                           (char (*) [55])"no section table present, not able to find Qt metadata");
                local_18 = anon_unknown.dwarf_1486d0f::ErrorMaker::notfound
                                     (in_stack_fffffffffffffdf0);
              }
              else if ((*(short *)(pvVar5 + 0x3c) == 0) ||
                      (*(ushort *)(pvVar5 + 0x3e) < *(ushort *)(pvVar5 + 0x3c))) {
                local_18 = scanSections(in_stack_000000a0,error_00);
              }
              else {
                uVar6 = 0;
                text = local_160;
                QLibrary::tr((char *)in_stack_fffffffffffffdb8,
                             (char *)CONCAT26(in_stack_fffffffffffffdb6,
                                              CONCAT24(in_stack_fffffffffffffdb4,
                                                       in_stack_fffffffffffffdb0)),
                             in_stack_fffffffffffffdac);
                uVar2 = (uint)*(ushort *)(pvVar5 + 0x3e);
                QChar::QChar<char16_t,_true>(&local_162,L' ');
                QString::arg<unsigned_short,_true>
                          ((QString *)in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb6,
                           in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac,fillChar);
                QChar::QChar<char16_t,_true>(&local_164,L' ');
                QString::arg<unsigned_short,_true>
                          ((QString *)in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb6,
                           in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac,fillChar);
                local_18 = anon_unknown.dwarf_1486d0f::ErrorMaker::operator()
                                     ((ErrorMaker *)CONCAT44(uVar6,uVar2),text);
                QString::~QString((QString *)0x8ca30f);
                QString::~QString((QString *)0x8ca31c);
                QString::~QString((QString *)0x8ca329);
              }
            }
            else {
              QLibrary::tr((char *)in_stack_fffffffffffffdb8,
                           (char *)CONCAT26(in_stack_fffffffffffffdb6,
                                            CONCAT24(in_stack_fffffffffffffdb4,
                                                     in_stack_fffffffffffffdb0)),
                           in_stack_fffffffffffffdac);
              QChar::QChar<char16_t,_true>(local_112,L' ');
              QString::arg<unsigned_short,_true>
                        ((QString *)in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb6,
                         in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac,fillChar);
              local_18 = anon_unknown.dwarf_1486d0f::ErrorMaker::operator()
                                   ((ErrorMaker *)
                                    CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                                    in_stack_fffffffffffffde0);
              QString::~QString((QString *)0x8ca11a);
              QString::~QString((QString *)0x8ca127);
            }
          }
        }
        else {
          local_18 = (QLibraryScanResult)ZEXT816(0);
        }
      }
      else {
        QLibrary::tr((char *)in_stack_fffffffffffffdb8,
                     (char *)CONCAT26(in_stack_fffffffffffffdb6,
                                      CONCAT24(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0))
                     ,in_stack_fffffffffffffdac);
        QChar::QChar<char16_t,_true>(local_ba,L' ');
        QString::arg<unsigned_short,_true>
                  ((QString *)in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb6,
                   in_stack_fffffffffffffdb0,in_stack_fffffffffffffdac,fillChar);
        local_18 = anon_unknown.dwarf_1486d0f::ErrorMaker::operator()
                             ((ErrorMaker *)
                              CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                              in_stack_fffffffffffffde0);
        QString::~QString((QString *)0x8c9f0d);
        QString::~QString((QString *)0x8c9f1a);
      }
    }
    else {
      anon_unknown.dwarf_1486d0f::ElfHeaderCheck<unsigned_long_long,_(QSysInfo::Endian)1>::
      explainCheckFailure(in_stack_fffffffffffffdb8);
      local_18 = anon_unknown.dwarf_1486d0f::ErrorMaker::operator()
                           ((ErrorMaker *)
                            CONCAT44(in_stack_fffffffffffffdec,in_stack_fffffffffffffde8),
                            in_stack_fffffffffffffde0);
      QString::~QString((QString *)0x8c9d02);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_18;
}

Assistant:

QLibraryScanResult QElfParser::parse(QByteArrayView data, QString *errMsg)
{
    ErrorMaker error(errMsg);
    if (size_t(data.size()) < sizeof(T::Ehdr)) {
        qEDebug << "file too small:" << size_t(data.size());
        return error(QLibrary::tr("file too small"));
    }

    qEDebug << ElfHeaderDebug{ reinterpret_cast<const uchar *>(data.data()) };

    auto header = reinterpret_cast<const T::Ehdr *>(data.data());
    if (!ElfHeaderCheck<>::checkHeader(*header))
        return error(ElfHeaderCheck<>::explainCheckFailure(*header));

    qEDebug << "contains" << header->e_phnum << "program headers of"
            << header->e_phentsize << "bytes at offset" << header->e_phoff;
    qEDebug << "contains" << header->e_shnum << "sections of" << header->e_shentsize
            << "bytes at offset" << header->e_shoff
            << "; section header string table (shstrtab) is entry" << header->e_shstrndx;

    // some sanity checks
    if constexpr (IncludeValidityChecks) {
        if (header->e_phentsize != sizeof(T::Phdr))
            return error(QLibrary::tr("unexpected program header entry size (%1)")
                         .arg(header->e_phentsize));
    }

    if (!preScanProgramHeaders(data, error))
        return {};

    if (QLibraryScanResult r = scanProgramHeadersForNotes(data, error); r.length)
        return r;

    if (!ElfNotesAreMandatory) {
        if constexpr (IncludeValidityChecks) {
            if (header->e_shentsize != sizeof(T::Shdr))
                return error(QLibrary::tr("unexpected section entry size (%1)")
                             .arg(header->e_shentsize));
        }
        if (header->e_shoff == 0 || header->e_shnum == 0) {
            // this is still a valid ELF file but we don't have a section table
            qEDebug << "no section table present, not able to find Qt metadata";
            return error.notfound();
        }

        if (header->e_shnum && header->e_shstrndx >= header->e_shnum)
            return error(QLibrary::tr("e_shstrndx greater than the number of sections e_shnum (%1 >= %2)")
                         .arg(header->e_shstrndx).arg(header->e_shnum));
        return scanSections(data, error);
    }
    return error.notfound();
}